

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_pnext_chain
          (Impl *this,Value *pnext,void **outpNext,StateCreatorInterface *iface,
          DatabaseInterface *resolver,Value *pipelines)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar1;
  bool bVar2;
  LogLevel LVar3;
  ConstValueIterator pGVar4;
  Type this_00;
  VkRenderingInputAttachmentIndexInfoKHR *local_1b0;
  VkRenderingInputAttachmentIndexInfoKHR *info_22;
  VkRenderingAttachmentLocationInfoKHR *info_21;
  VkPipelineViewportDepthClampControlCreateInfoEXT *info_20;
  VkPipelineRobustnessCreateInfoEXT *info_19;
  VkSampleLocationsInfoEXT *info_18;
  VkRenderPassFragmentDensityMapCreateInfoEXT *info_17;
  VkDepthBiasRepresentationInfoEXT *info_16;
  VkMultisampledRenderToSingleSampledInfoEXT *info_15;
  VkSamplerBorderColorComponentMappingCreateInfoEXT *info_14;
  VkRenderPassCreationControlEXT *info_13;
  VkPipelineCreateFlags2CreateInfoKHR *flags2;
  VkPipelineViewportDepthClipControlCreateInfoEXT *clip;
  VkPipelineLibraryCreateInfoKHR *library;
  VkGraphicsPipelineLibraryCreateInfoEXT *graphics_pipeline_library;
  VkSamplerYcbcrConversionCreateInfo *conv;
  VkPipelineFragmentShadingRateStateCreateInfoKHR *fragment_shading_rate;
  VkMemoryBarrier2KHR *memory_barrier2;
  VkPipelineDiscardRectangleStateCreateInfoEXT *discard_rectangles;
  VkRenderPassInputAttachmentAspectCreateInfo *input_att;
  VkSamplerReductionModeCreateInfo *reduction_mode;
  VkSamplerCustomBorderColorCreateInfoEXT *custom_border_color;
  VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *provoking_vertex;
  VkPipelineSampleLocationsStateCreateInfoEXT *sample_locations;
  VkPipelineColorWriteCreateInfoEXT *color_write;
  VkPipelineRenderingCreateInfoKHR *rendering;
  VkFragmentShadingRateAttachmentInfoKHR *rate;
  VkSubpassDescriptionDepthStencilResolve *resolve;
  VkAttachmentReferenceStencilLayout *info_12;
  VkAttachmentDescriptionStencilLayout *info_11;
  VkMutableDescriptorTypeCreateInfoEXT *info_10;
  VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *info_9;
  VkPipelineRasterizationLineStateCreateInfoKHR *info_8;
  VkPipelineRasterizationConservativeStateCreateInfoEXT *info_7;
  VkPipelineColorBlendAdvancedStateCreateInfoEXT *info_6;
  VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *info_5;
  VkRenderPassMultiviewCreateInfo *info_4;
  VkPipelineRasterizationStateStreamCreateInfoEXT *info_3;
  VkPipelineRasterizationDepthClipStateCreateInfoEXT *info_2;
  VkPipelineVertexInputDivisorStateCreateInfoKHR *info_1;
  VkPipelineTessellationDomainOriginStateCreateInfo *info;
  VkBaseInStructure *new_struct;
  Value *pVStack_60;
  VkStructureType sType;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *next;
  ConstValueIterator itr;
  VkBaseInStructure *chain;
  VkBaseInStructure *ret;
  Value *pipelines_local;
  DatabaseInterface *resolver_local;
  StateCreatorInterface *iface_local;
  void **outpNext_local;
  Value *pnext_local;
  Impl *this_local;
  
  chain = (VkBaseInStructure *)0x0;
  itr = (ConstValueIterator)0x0;
  ret = (VkBaseInStructure *)pipelines;
  pipelines_local = (Value *)resolver;
  resolver_local = (DatabaseInterface *)iface;
  iface_local = (StateCreatorInterface *)outpNext;
  outpNext_local = (void **)pnext;
  pnext_local = (Value *)this;
  next = rapidjson::
         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         ::Begin(pnext);
  do {
    pGVar1 = next;
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)outpNext_local);
    if (pGVar1 == pGVar4) {
      iface_local->_vptr_StateCreatorInterface = (_func_int **)chain;
      return true;
    }
    pVStack_60 = next;
    this_00 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)next,"sType");
    new_struct._4_4_ =
         rapidjson::
         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         ::GetInt(this_00);
    info = (VkPipelineTessellationDomainOriginStateCreateInfo *)0x0;
    if (new_struct._4_4_ == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT) {
      info_4 = (VkRenderPassMultiviewCreateInfo *)0x0;
      bVar2 = parse_rasterization_stream_state
                        (this,pVStack_60,(VkPipelineRasterizationStateStreamCreateInfoEXT **)&info_4
                        );
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_4;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO) {
      color_write = (VkPipelineColorWriteCreateInfoEXT *)0x0;
      bVar2 = parse_pipeline_rendering_info
                        (this,pVStack_60,(VkPipelineRenderingCreateInfoKHR **)&color_write);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)color_write;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO) {
      info_5 = (VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *)0x0;
      bVar2 = parse_multiview_state(this,pVStack_60,(VkRenderPassMultiviewCreateInfo **)&info_5);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_5;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO) {
      info_20 = (VkPipelineViewportDepthClampControlCreateInfoEXT *)0x0;
      bVar2 = parse_pipeline_robustness
                        (this,pVStack_60,(VkPipelineRobustnessCreateInfoEXT **)&info_20);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_20;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT)
    {
      memory_barrier2 = (VkMemoryBarrier2KHR *)0x0;
      bVar2 = parse_discard_rectangles
                        (this,pVStack_60,
                         (VkPipelineDiscardRectangleStateCreateInfoEXT **)&memory_barrier2);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)memory_barrier2;
    }
    else if (new_struct._4_4_ ==
             VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT) {
      info_8 = (VkPipelineRasterizationLineStateCreateInfoKHR *)0x0;
      bVar2 = parse_rasterization_conservative_state
                        (this,pVStack_60,
                         (VkPipelineRasterizationConservativeStateCreateInfoEXT **)&info_8);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_8;
    }
    else if (new_struct._4_4_ ==
             VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT) {
      info_3 = (VkPipelineRasterizationStateStreamCreateInfoEXT *)0x0;
      bVar2 = parse_rasterization_depth_clip_state
                        (this,pVStack_60,
                         (VkPipelineRasterizationDepthClipStateCreateInfoEXT **)&info_3);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_3;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO)
    {
      discard_rectangles = (VkPipelineDiscardRectangleStateCreateInfoEXT *)0x0;
      bVar2 = parse_input_attachment_aspect
                        (this,pVStack_60,
                         (VkRenderPassInputAttachmentAspectCreateInfo **)&discard_rectangles);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)discard_rectangles;
    }
    else if (new_struct._4_4_ ==
             VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO) {
      info_1 = (VkPipelineVertexInputDivisorStateCreateInfoKHR *)0x0;
      bVar2 = parse_tessellation_domain_origin_state
                        (this,pVStack_60,
                         (VkPipelineTessellationDomainOriginStateCreateInfo **)&info_1);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_1;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO) {
      input_att = (VkRenderPassInputAttachmentAspectCreateInfo *)0x0;
      bVar2 = parse_sampler_reduction_mode
                        (this,pVStack_60,(VkSamplerReductionModeCreateInfo **)&input_att);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)input_att;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT) {
      info_19 = (VkPipelineRobustnessCreateInfoEXT *)0x0;
      bVar2 = parse_sample_locations_info(this,pVStack_60,(VkSampleLocationsInfoEXT **)&info_19);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_19;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT)
    {
      provoking_vertex = (VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *)0x0;
      bVar2 = parse_sample_locations
                        (this,pVStack_60,
                         (VkPipelineSampleLocationsStateCreateInfoEXT **)&provoking_vertex);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)provoking_vertex;
    }
    else if (new_struct._4_4_ ==
             VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT) {
      info_7 = (VkPipelineRasterizationConservativeStateCreateInfoEXT *)0x0;
      bVar2 = parse_color_blend_advanced_state
                        (this,pVStack_60,(VkPipelineColorBlendAdvancedStateCreateInfoEXT **)&info_7)
      ;
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_7;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO) {
      graphics_pipeline_library = (VkGraphicsPipelineLibraryCreateInfoEXT *)0x0;
      bVar2 = parse_sampler_ycbcr_conversion
                        (this,pVStack_60,
                         (VkSamplerYcbcrConversionCreateInfo **)&graphics_pipeline_library);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)graphics_pipeline_library;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO)
    {
      info_6 = (VkPipelineColorBlendAdvancedStateCreateInfoEXT *)0x0;
      bVar2 = parse_descriptor_set_binding_flags
                        (this,pVStack_60,(VkDescriptorSetLayoutBindingFlagsCreateInfoEXT **)&info_6)
      ;
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_6;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO)
    {
      info_2 = (VkPipelineRasterizationDepthClipStateCreateInfoEXT *)0x0;
      bVar2 = parse_vertex_input_divisor_state
                        (this,pVStack_60,(VkPipelineVertexInputDivisorStateCreateInfoKHR **)&info_2)
      ;
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_2;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE) {
      rate = (VkFragmentShadingRateAttachmentInfoKHR *)0x0;
      bVar2 = parse_subpass_description_depth_stencil_resolve
                        (this,pVStack_60,(VkSubpassDescriptionDepthStencilResolve **)&rate);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)rate;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT)
    {
      info_18 = (VkSampleLocationsInfoEXT *)0x0;
      bVar2 = parse_render_pass_fragment_density_map
                        (this,pVStack_60,(VkRenderPassFragmentDensityMapCreateInfoEXT **)&info_18);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_18;
    }
    else if (new_struct._4_4_ ==
             VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO) {
      info_10 = (VkMutableDescriptorTypeCreateInfoEXT *)0x0;
      bVar2 = parse_shader_stage_required_subgroup_size
                        (this,pVStack_60,
                         (VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT **)&info_10);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_10;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR) {
      rendering = (VkPipelineRenderingCreateInfoKHR *)0x0;
      bVar2 = parse_fragment_shading_rate_attachment_info
                        (this,pVStack_60,(VkFragmentShadingRateAttachmentInfoKHR **)&rendering);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)rendering;
    }
    else if (new_struct._4_4_ ==
             VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR) {
      conv = (VkSamplerYcbcrConversionCreateInfo *)0x0;
      bVar2 = parse_fragment_shading_rate
                        (this,pVStack_60,(VkPipelineFragmentShadingRateStateCreateInfoKHR **)&conv);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)conv;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO) {
      info_22 = (VkRenderingInputAttachmentIndexInfoKHR *)0x0;
      bVar2 = parse_rendering_attachment_location_info
                        (this,pVStack_60,(VkRenderingAttachmentLocationInfoKHR **)&info_22);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_22;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO) {
      local_1b0 = (VkRenderingInputAttachmentIndexInfoKHR *)0x0;
      bVar2 = parse_rendering_input_attachment_index_info(this,pVStack_60,&local_1b0);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)local_1b0;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT) {
      resolve = (VkSubpassDescriptionDepthStencilResolve *)0x0;
      bVar2 = parse_attachment_reference_stencil_layout
                        (this,pVStack_60,(VkAttachmentReferenceStencilLayout **)&resolve);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)resolve;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT) {
      info_12 = (VkAttachmentReferenceStencilLayout *)0x0;
      bVar2 = parse_attachment_description_stencil_layout
                        (this,pVStack_60,(VkAttachmentDescriptionStencilLayout **)&info_12);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_12;
    }
    else if (new_struct._4_4_ ==
             VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT) {
      custom_border_color = (VkSamplerCustomBorderColorCreateInfoEXT *)0x0;
      bVar2 = parse_provoking_vertex
                        (this,pVStack_60,
                         (VkPipelineRasterizationProvokingVertexStateCreateInfoEXT **)
                         &custom_border_color);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)custom_border_color;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO) {
      info_9 = (VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *)0x0;
      bVar2 = parse_rasterization_line_state
                        (this,pVStack_60,(VkPipelineRasterizationLineStateCreateInfoKHR **)&info_9);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_9;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT) {
      info_17 = (VkRenderPassFragmentDensityMapCreateInfoEXT *)0x0;
      bVar2 = parse_depth_bias_representation
                        (this,pVStack_60,(VkDepthBiasRepresentationInfoEXT **)&info_17);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_17;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT) {
      reduction_mode = (VkSamplerReductionModeCreateInfo *)0x0;
      bVar2 = parse_sampler_custom_border_color
                        (this,pVStack_60,(VkSamplerCustomBorderColorCreateInfoEXT **)&reduction_mode
                        );
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)reduction_mode;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR) {
      clip = (VkPipelineViewportDepthClipControlCreateInfoEXT *)0x0;
      if ((resolver_local == (DatabaseInterface *)0x0) || (ret == (VkBaseInStructure *)0x0)) {
        return false;
      }
      bVar2 = parse_pipeline_library
                        (this,(StateCreatorInterface *)resolver_local,
                         (DatabaseInterface *)pipelines_local,(Value *)ret,pVStack_60,
                         RESOURCE_GRAPHICS_PIPELINE,(VkPipelineLibraryCreateInfoKHR **)&clip);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)clip;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_MEMORY_BARRIER_2) {
      fragment_shading_rate = (VkPipelineFragmentShadingRateStateCreateInfoKHR *)0x0;
      bVar2 = parse_memory_barrier2(this,pVStack_60,(VkMemoryBarrier2KHR **)&fragment_shading_rate);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)fragment_shading_rate;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT) {
      library = (VkPipelineLibraryCreateInfoKHR *)0x0;
      bVar2 = parse_graphics_pipeline_library
                        (this,pVStack_60,(VkGraphicsPipelineLibraryCreateInfoEXT **)&library);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)library;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT) {
      info_11 = (VkAttachmentDescriptionStencilLayout *)0x0;
      bVar2 = parse_mutable_descriptor_type
                        (this,pVStack_60,(VkMutableDescriptorTypeCreateInfoEXT **)&info_11);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_11;
    }
    else if (new_struct._4_4_ ==
             VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT) {
      flags2 = (VkPipelineCreateFlags2CreateInfoKHR *)0x0;
      bVar2 = parse_viewport_depth_clip_control
                        (this,pVStack_60,(VkPipelineViewportDepthClipControlCreateInfoEXT **)&flags2
                        );
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)flags2;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT) {
      info_16 = (VkDepthBiasRepresentationInfoEXT *)0x0;
      bVar2 = parse_multisampled_render_to_single_sampled
                        (this,pVStack_60,(VkMultisampledRenderToSingleSampledInfoEXT **)&info_16);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_16;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT) {
      sample_locations = (VkPipelineSampleLocationsStateCreateInfoEXT *)0x0;
      bVar2 = parse_color_write(this,pVStack_60,
                                (VkPipelineColorWriteCreateInfoEXT **)&sample_locations);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)sample_locations;
    }
    else if (new_struct._4_4_ ==
             VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT) {
      info_15 = (VkMultisampledRenderToSingleSampledInfoEXT *)0x0;
      bVar2 = parse_sampler_border_color_component_mapping
                        (this,pVStack_60,
                         (VkSamplerBorderColorComponentMappingCreateInfoEXT **)&info_15);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_15;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT) {
      info_14 = (VkSamplerBorderColorComponentMappingCreateInfoEXT *)0x0;
      bVar2 = parse_render_pass_creation_control
                        (this,pVStack_60,(VkRenderPassCreationControlEXT **)&info_14);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_14;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO) {
      info_13 = (VkRenderPassCreationControlEXT *)0x0;
      bVar2 = parse_pipeline_create_flags2
                        (this,pVStack_60,(VkPipelineCreateFlags2CreateInfoKHR **)&info_13);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_13;
    }
    else {
      if (new_struct._4_4_ !=
          VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT) {
        LVar3 = get_thread_log_level();
        if (((int)LVar3 < 3) &&
           (bVar2 = Internal::log_thread_callback
                              (LOG_ERROR,"Failed to parse pNext chain for sType: %d\n",
                               (ulong)new_struct._4_4_), !bVar2)) {
          fprintf(_stderr,"Fossilize ERROR: Failed to parse pNext chain for sType: %d\n",
                  (ulong)new_struct._4_4_);
        }
        return false;
      }
      info_21 = (VkRenderingAttachmentLocationInfoKHR *)0x0;
      bVar2 = parse_depth_clamp_control
                        (this,pVStack_60,
                         (VkPipelineViewportDepthClampControlCreateInfoEXT **)&info_21);
      if (!bVar2) {
        return false;
      }
      info = (VkPipelineTessellationDomainOriginStateCreateInfo *)info_21;
    }
    info->sType = new_struct._4_4_;
    info->pNext = (void *)0x0;
    if (itr == (ConstValueIterator)0x0) {
      chain = (VkBaseInStructure *)info;
    }
    else {
      (itr->data_).o.members = (Member *)info;
    }
    itr = (ConstValueIterator)info;
    next = next + 1;
  } while( true );
}

Assistant:

bool StateReplayer::Impl::parse_pnext_chain(
		const Value &pnext, const void **outpNext,
		StateCreatorInterface *iface, DatabaseInterface *resolver,
		const Value *pipelines)
{
	VkBaseInStructure *ret = nullptr;
	VkBaseInStructure *chain = nullptr;

	for (auto itr = pnext.Begin(); itr != pnext.End(); ++itr)
	{
		auto &next = *itr;
		auto sType = static_cast<VkStructureType>(next["sType"].GetInt());
		VkBaseInStructure *new_struct = nullptr;

		switch (sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO:
		{
			VkPipelineTessellationDomainOriginStateCreateInfo *info = nullptr;
			if (!parse_tessellation_domain_origin_state(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_KHR:
		{
			VkPipelineVertexInputDivisorStateCreateInfoKHR *info = nullptr;
			if (!parse_vertex_input_divisor_state(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT:
		{
			VkPipelineRasterizationDepthClipStateCreateInfoEXT *info = nullptr;
			if (!parse_rasterization_depth_clip_state(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT:
		{
			VkPipelineRasterizationStateStreamCreateInfoEXT *info = nullptr;
			if (!parse_rasterization_stream_state(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO:
		{
			VkRenderPassMultiviewCreateInfo *info = nullptr;
			if (!parse_multiview_state(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO_EXT:
		{
			VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *info = nullptr;
			if (!parse_descriptor_set_binding_flags(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT:
		{
			VkPipelineColorBlendAdvancedStateCreateInfoEXT *info = nullptr;
			if (!parse_color_blend_advanced_state(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT:
		{
			VkPipelineRasterizationConservativeStateCreateInfoEXT *info = nullptr;
			if (!parse_rasterization_conservative_state(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_KHR:
		{
			VkPipelineRasterizationLineStateCreateInfoKHR *info = nullptr;
			if (!parse_rasterization_line_state(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT:
		{
			VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *info = nullptr;
			if (!parse_shader_stage_required_subgroup_size(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT:
		{
			VkMutableDescriptorTypeCreateInfoEXT *info = nullptr;
			if (!parse_mutable_descriptor_type(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT:
		{
			VkAttachmentDescriptionStencilLayout *info = nullptr;
			if (!parse_attachment_description_stencil_layout(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT:
		{
			VkAttachmentReferenceStencilLayout *info = nullptr;
			if (!parse_attachment_reference_stencil_layout(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE:
		{
			VkSubpassDescriptionDepthStencilResolve *resolve = nullptr;
			if (!parse_subpass_description_depth_stencil_resolve(next, &resolve))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(resolve);
			break;
		}

		case VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR:
		{
			VkFragmentShadingRateAttachmentInfoKHR *rate = nullptr;
			if (!parse_fragment_shading_rate_attachment_info(next, &rate))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(rate);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR:
		{
			VkPipelineRenderingCreateInfoKHR *rendering = nullptr;
			if (!parse_pipeline_rendering_info(next, &rendering))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(rendering);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT:
		{
			VkPipelineColorWriteCreateInfoEXT *color_write = nullptr;
			if (!parse_color_write(next, &color_write))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(color_write);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT:
		{
			VkPipelineSampleLocationsStateCreateInfoEXT *sample_locations = nullptr;
			if (!parse_sample_locations(next, &sample_locations))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(sample_locations);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT:
		{
			VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *provoking_vertex = nullptr;
			if (!parse_provoking_vertex(next, &provoking_vertex))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(provoking_vertex);
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT:
		{
			VkSamplerCustomBorderColorCreateInfoEXT *custom_border_color = nullptr;
			if (!parse_sampler_custom_border_color(next, &custom_border_color))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(custom_border_color);
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO:
		{
			VkSamplerReductionModeCreateInfo *reduction_mode = nullptr;
			if (!parse_sampler_reduction_mode(next, &reduction_mode))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(reduction_mode);
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO:
		{
			VkRenderPassInputAttachmentAspectCreateInfo *input_att = nullptr;
			if (!parse_input_attachment_aspect(next, &input_att))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(input_att);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT:
		{
			VkPipelineDiscardRectangleStateCreateInfoEXT *discard_rectangles = nullptr;
			if (!parse_discard_rectangles(next, &discard_rectangles))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(discard_rectangles);
			break;
		}

		case VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR:
		{
			VkMemoryBarrier2KHR *memory_barrier2 = nullptr;
			if (!parse_memory_barrier2(next, &memory_barrier2))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(memory_barrier2);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR:
		{
			VkPipelineFragmentShadingRateStateCreateInfoKHR *fragment_shading_rate = nullptr;
			if (!parse_fragment_shading_rate(next, &fragment_shading_rate))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(fragment_shading_rate);
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO:
		{
			VkSamplerYcbcrConversionCreateInfo *conv = nullptr;
			if (!parse_sampler_ycbcr_conversion(next, &conv))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(conv);
			break;
		}

		case VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT:
		{
			VkGraphicsPipelineLibraryCreateInfoEXT *graphics_pipeline_library = nullptr;
			if (!parse_graphics_pipeline_library(next, &graphics_pipeline_library))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(graphics_pipeline_library);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR:
		{
			VkPipelineLibraryCreateInfoKHR *library = nullptr;
			if (!iface || !pipelines)
				return false;
			if (!parse_pipeline_library(*iface, resolver, *pipelines, next, RESOURCE_GRAPHICS_PIPELINE, &library))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(library);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT:
		{
			VkPipelineViewportDepthClipControlCreateInfoEXT *clip = nullptr;
			if (!parse_viewport_depth_clip_control(next, &clip))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(clip);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR:
		{
			VkPipelineCreateFlags2CreateInfoKHR *flags2 = nullptr;
			if (!parse_pipeline_create_flags2(next, &flags2))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(flags2);
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT:
		{
			VkRenderPassCreationControlEXT *info = nullptr;
			if (!parse_render_pass_creation_control(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT:
		{
			VkSamplerBorderColorComponentMappingCreateInfoEXT *info = nullptr;
			if (!parse_sampler_border_color_component_mapping(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT:
		{
			VkMultisampledRenderToSingleSampledInfoEXT *info = nullptr;
			if (!parse_multisampled_render_to_single_sampled(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT:
		{
			VkDepthBiasRepresentationInfoEXT *info = nullptr;
			if (!parse_depth_bias_representation(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT:
		{
			VkRenderPassFragmentDensityMapCreateInfoEXT *info = nullptr;
			if (!parse_render_pass_fragment_density_map(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT:
		{
			VkSampleLocationsInfoEXT *info = nullptr;
			if (!parse_sample_locations_info(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT:
		{
			VkPipelineRobustnessCreateInfoEXT *info = nullptr;
			if (!parse_pipeline_robustness(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT:
		{
			VkPipelineViewportDepthClampControlCreateInfoEXT *info = nullptr;
			if (!parse_depth_clamp_control(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR:
		{
			VkRenderingAttachmentLocationInfoKHR *info = nullptr;
			if (!parse_rendering_attachment_location_info(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		case VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR:
		{
			VkRenderingInputAttachmentIndexInfoKHR *info = nullptr;
			if (!parse_rendering_input_attachment_index_info(next, &info))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(info);
			break;
		}

		default:
			LOGE_LEVEL("Failed to parse pNext chain for sType: %d\n", int(sType));
			return false;
		}

		new_struct->sType = sType;
		new_struct->pNext = nullptr;

		if (!chain)
		{
			chain = new_struct;
			ret = chain;
		}
		else
		{
			chain->pNext = new_struct;
			chain = new_struct;
		}
	}

	*outpNext = ret;
	return true;
}